

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

Node * __thiscall Node::add_child(Node *this,player_move *playerMove)

{
  Node *node;
  
  node = (Node *)operator_new(0x40);
  node->m_parent_node = this;
  node->exploration = 0.7;
  node->m_move = playerMove;
  (node->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node->m_wins = 0;
  node->m_visits = 0;
  node->m_avails = 1;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->m_children,&node);
  return node;
}

Assistant:

Node* Node::add_child(player_move playerMove)
{
    Node* node = new Node(&playerMove, this);
    this->m_children.push_back(node);
    return node;
}